

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O1

string * __thiscall
inja::Environment::load_file(string *__return_storage_ptr__,Environment *this,string *filename)

{
  Parser parser;
  path pStack_1f8;
  path local_1d0;
  Parser local_1a8;
  
  Parser::Parser(&local_1a8,&this->parser_config,&this->lexer_config,&this->template_storage,
                 &this->function_storage);
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&pStack_1f8,filename,auto_format);
  std::filesystem::__cxx11::operator/(&local_1d0,&this->input_path,&pStack_1f8);
  Parser::load_file(__return_storage_ptr__,&local_1d0);
  std::filesystem::__cxx11::path::~path(&local_1d0);
  std::filesystem::__cxx11::path::~path(&pStack_1f8);
  std::_Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>::
  ~_Deque_base((_Deque_base<inja::BlockStatementNode_*,_std::allocator<inja::BlockStatementNode_*>_>
                *)&local_1a8.block_statement_stack);
  std::_Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_>::
  ~_Deque_base((_Deque_base<inja::ForStatementNode_*,_std::allocator<inja::ForStatementNode_*>_> *)
               &local_1a8.for_statement_stack);
  std::_Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_>::~_Deque_base
            ((_Deque_base<inja::IfStatementNode_*,_std::allocator<inja::IfStatementNode_*>_> *)
             &local_1a8.if_statement_stack);
  return __return_storage_ptr__;
}

Assistant:

std::string load_file(const std::string& filename) {
    Parser parser(parser_config, lexer_config, template_storage, function_storage);
    return Parser::load_file(input_path / filename);
  }